

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O0

void dumpDictKeys(object *dict)

{
  ulong *puVar1;
  ulong uVar2;
  ulong *puVar3;
  byteObject *key_1;
  int i;
  int numKeys;
  object *key;
  object *keys;
  object *dict_local;
  
  if (dict == (object *)0x0) {
    info_impl("dumpDictKeys",0x76,"Null dictionary oop passed!");
  }
  else {
    puVar1 = (ulong *)dict[1].header;
    if (puVar1 == (ulong *)0x0) {
      info_impl("dumpDictKeys",0x7c,"Dictionary does not have any keys!");
    }
    else {
      uVar2 = *puVar1;
      for (key_1._0_4_ = 0; (int)key_1 < (int)((uint)(uVar2 >> 2) & 0x3fffffff);
          key_1._0_4_ = (int)key_1 + 1) {
        puVar3 = (ulong *)puVar1[(long)(int)key_1 + 2];
        if (puVar3 != (ulong *)0x0) {
          printf("%.*s ",*puVar3 >> 2 & 0x3fffffff,puVar3 + 2);
        }
      }
    }
  }
  return;
}

Assistant:

void dumpDictKeys(struct object *dict)
{
    struct object *keys;
    struct object *key;
    int numKeys = 0;

    if(!dict) {
        info("Null dictionary oop passed!");
        return;
    }

    keys = dict->data[keysInDictionary];
    if(!keys) {
        info("Dictionary does not have any keys!");
        return;
    }

    numKeys = SIZE(keys);

    for(int i=0; i<numKeys; i++) {
        struct byteObject *key = (struct byteObject *)keys->data[i];

        if(key) {
            printf("%.*s ", SIZE(key), bytePtr(key));
        }
    }
}